

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

void __thiscall AMovingCamera::PostBeginPlay(AMovingCamera *this)

{
  bool bVar1;
  AActor *q;
  undefined1 local_20 [8];
  TActorIterator<AActor> iterator;
  AMovingCamera *this_local;
  
  iterator.super_FActorIterator._8_8_ = this;
  APathFollower::PostBeginPlay(&this->super_APathFollower);
  TObjPtr<AActor>::operator=(&this->Activator,(AActor *)0x0);
  if ((this->super_APathFollower).super_AActor.args[3] != 0) {
    TActorIterator<AActor>::TActorIterator
              ((TActorIterator<AActor> *)local_20,(this->super_APathFollower).super_AActor.args[3]);
    q = TActorIterator<AActor>::Next((TActorIterator<AActor> *)local_20);
    TObjPtr<AActor>::operator=(&(this->super_APathFollower).super_AActor.tracer,q);
    bVar1 = TObjPtr<AActor>::operator==
                      (&(this->super_APathFollower).super_AActor.tracer,(AActor *)0x0);
    if (bVar1) {
      Printf("MovingCamera %d: Can\'t find thing %d\n",
             (ulong)(uint)(this->super_APathFollower).super_AActor.tid,
             (ulong)(uint)(this->super_APathFollower).super_AActor.args[3]);
    }
  }
  return;
}

Assistant:

void AMovingCamera::PostBeginPlay ()
{
	Super::PostBeginPlay ();

	Activator = NULL;
	if (args[3] != 0)
	{
		TActorIterator<AActor> iterator (args[3]);
		tracer = iterator.Next ();
		if (tracer == NULL)
		{
			Printf ("MovingCamera %d: Can't find thing %d\n", tid, args[3]);
		}
	}
}